

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O0

uint GFMulHelper<unsigned_int,_32,_LFSR<BitsInt<unsigned_int,_32>,_141U>,_BitsInt<unsigned_int,_32>,_26>
     ::Run(uint *a,uint *b)

{
  long lVar1;
  uint uVar2;
  uint *in_RSI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined1 cond;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LFSR<BitsInt<unsigned_int,_32>,_141U>::Call
            ((I *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  uVar2 = GFMulHelper<unsigned_int,_32,_LFSR<BitsInt<unsigned_int,_32>,_141U>,_BitsInt<unsigned_int,_32>,_25>
          ::Run(in_RSI,(uint *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  cond = (undefined1)(uVar2 >> 0x18);
  BitsInt<unsigned_int,32>::MidBits<6,1>(in_stack_ffffffffffffffdc);
  uVar2 = BitsInt<unsigned_int,_32>::CondXorWith(in_stack_ffffffffffffffdc,(bool)cond,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

static inline constexpr I Run(const I& a, const I& b) { return F::CondXorWith(GFMulHelper<I, N, L, F, K - 1>::Run(L::Call(a), b), F::template MidBits<N - K, 1>(b), a); }